

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O0

vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_> *
__thiscall
iDynTree::optimalcontrol::OptimalControlProblem::getConstraintsTimeRanges
          (OptimalControlProblem *this)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  ConstraintsGroup *this_00;
  vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
  *this_01;
  reference pvVar4;
  long *in_RDI;
  size_t i;
  vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
  *groupTimeRanges;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>
  *group;
  iterator __end2;
  iterator __begin2;
  ConstraintsGroupsMap *__range2;
  size_t index;
  uint nc;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
  *in_stack_ffffffffffffff98;
  reference in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffb8;
  ulong uVar5;
  ulong __n;
  vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
  *in_stack_ffffffffffffffc0;
  _Self local_30;
  _Self local_28;
  size_type local_18;
  
  uVar2 = countConstraints((OptimalControlProblem *)in_stack_ffffffffffffffc0);
  sVar3 = std::
          vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
          ::size((vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
                  *)(*in_RDI + 0x428));
  if (sVar3 != uVar2) {
    std::
    vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
    ::resize(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  local_18 = 0;
  this_00 = (ConstraintsGroup *)(*in_RDI + 0x28);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
       ::begin(in_stack_ffffffffffffff98);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
       ::end(in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
                 *)0x2fa00f);
    std::
    __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2fa022);
    std::
    __shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2fa02a);
    this_01 = ConstraintsGroup::getTimeRanges(this_00);
    uVar5 = 0;
    while( true ) {
      __n = uVar5;
      sVar3 = std::
              vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
              ::size(this_01);
      if (sVar3 <= uVar5) break;
      in_stack_ffffffffffffffa0 =
           std::
           vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
           ::operator[](this_01,__n);
      pvVar4 = std::
               vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
               ::operator[]((vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
                             *)(*in_RDI + 0x428),local_18);
      pvVar4->m_initTime = in_stack_ffffffffffffffa0->m_initTime;
      pvVar4->m_endTime = in_stack_ffffffffffffffa0->m_endTime;
      pvVar4->m_anyTime = in_stack_ffffffffffffffa0->m_anyTime;
      local_18 = local_18 + 1;
      uVar5 = __n + 1;
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
                  *)in_stack_ffffffffffffffa0);
  }
  return (vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
          *)(*in_RDI + 0x428);
}

Assistant:

std::vector<TimeRange> &OptimalControlProblem::getConstraintsTimeRanges() const
        {
            unsigned int nc = countConstraints();

            if (m_pimpl->constraintsTimeRanges.size() != nc)
                m_pimpl->constraintsTimeRanges.resize(nc);

            size_t index = 0;

            for (auto& group : m_pimpl->constraintsGroups){
                std::vector<TimeRange> &groupTimeRanges = group.second->group_ptr->getTimeRanges();
                for (size_t i = 0; i < groupTimeRanges.size(); ++i){
                    m_pimpl->constraintsTimeRanges[index] = groupTimeRanges[i];
                    ++index;
                }
            }
            return m_pimpl->constraintsTimeRanges;
        }